

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O2

Maybe<kj::String> * __thiscall
kj::anon_unknown_8::DiskHandle::createNamedTemporary
          (Maybe<kj::String> *__return_storage_ptr__,DiskHandle *this,PathPtr finalName,
          WriteMode mode,Function<int_(kj::StringPtr)> *tryCreate)

{
  Iface *pIVar1;
  PathPtr finalName_00;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  Array<char> *other;
  Own<kj::Function<int_(kj::StringPtr)>::Iface> *this_00;
  PathPtr PVar5;
  undefined6 in_stack_ffffffffffffff40;
  undefined1 uVar6;
  undefined1 uVar7;
  PathPtr finalName_local;
  String path;
  Fault f_1;
  String pathPrefix;
  Own<kj::Function<int_(kj::StringPtr)>::Iface> local_58;
  Own<kj::Function<int_(kj::StringPtr)>::Iface> local_48;
  
  pcVar4 = (char *)finalName.parts.size_;
  finalName_local.parts.ptr = finalName.parts.ptr;
  finalName_local.parts.size_ = (size_t)pcVar4;
  if (pcVar4 == (char *)0x0) {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19]>
              ((Fault *)&pathPrefix,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
               ,0x370,FAILED,(char *)0x0,"\"can\'t replace self\"",
               (char (*) [19])"can\'t replace self");
    _::Debug::Fault::~Fault((Fault *)&pathPrefix);
    (__return_storage_ptr__->ptr).isSet = false;
    return __return_storage_ptr__;
  }
  other = (Array<char> *)this;
  if (((anonymous_namespace)::DiskHandle::
       createNamedTemporary(kj::PathPtr,kj::WriteMode,kj::Function<int(kj::StringPtr)>)::pid == '\0'
      ) && (iVar3 = __cxa_guard_acquire(&(anonymous_namespace)::DiskHandle::
                                         createNamedTemporary(kj::PathPtr,kj::WriteMode,kj::Function<int(kj::StringPtr)>)
                                         ::pid), iVar3 != 0)) {
    createNamedTemporary::pid = getpid();
    __cxa_guard_release(&(anonymous_namespace)::DiskHandle::
                         createNamedTemporary(kj::PathPtr,kj::WriteMode,kj::Function<int(kj::StringPtr)>)
                         ::pid);
  }
  pathPrefix.content.disposer = (ArrayDisposer *)0x0;
  pathPrefix.content.ptr = (char *)0x0;
  pathPrefix.content.size_ = 0;
  if (1 < finalName_local.parts.size_) {
    _f_1 = (ArrayPtr<const_kj::String>)PathPtr::parent(&finalName_local);
    str<kj::PathPtr,char>(&path,(kj *)&f_1,(PathPtr *)&stack0xffffffffffffff46,pcVar4);
    other = &path.content;
    Array<char>::operator=(&pathPrefix.content,other);
    Array<char>::~Array(&path.content);
  }
  uVar6 = 0x2e;
  f_1.exception._0_4_ = createNamedTemporary::counter;
  uVar7 = 0x2e;
  createNamedTemporary::counter = createNamedTemporary::counter + 1;
  pcVar4 = PathPtr::basename(&finalName_local,(char *)other);
  str<kj::String&,char_const(&)[9],int_const&,char,unsigned_int,char,kj::String_const&,char_const(&)[9]>
            (&path,(kj *)&pathPrefix,(String *)".kj-tmp.",(char (*) [9])&createNamedTemporary::pid,
             (int *)&stack0xffffffffffffff46,(char *)&f_1,(uint *)&stack0xffffffffffffff47,pcVar4,
             (String *)".partial",
             (char (*) [9])CONCAT17(uVar7,CONCAT16(uVar6,in_stack_ffffffffffffff40)));
  do {
    pcVar4 = "";
    if (path.content.size_ != 0) {
      pcVar4 = path.content.ptr;
    }
    pIVar1 = (tryCreate->impl).ptr;
    iVar3 = (**pIVar1->_vptr_Iface)(pIVar1,pcVar4,path.content.size_ + (path.content.size_ == 0));
    if (-1 < iVar3) goto LAB_0031c2dc;
    iVar3 = _::Debug::getOsErrorNumber(false);
  } while (iVar3 == -1);
  if (iVar3 == 0) {
LAB_0031c2dc:
    (__return_storage_ptr__->ptr).isSet = true;
    (__return_storage_ptr__->ptr).field_1.value.content.ptr = path.content.ptr;
    (__return_storage_ptr__->ptr).field_1.value.content.size_ = path.content.size_;
    (__return_storage_ptr__->ptr).field_1.value.content.disposer = path.content.disposer;
    path.content.ptr = (char *)0x0;
    path.content.size_ = 0;
    goto LAB_0031c3aa;
  }
  if (iVar3 == 2) {
    if (((mode & CREATE_PARENT) != 0) && (1 < finalName_local.parts.size_)) {
      PVar5 = PathPtr::parent(&finalName_local);
      bVar2 = tryMkdir(this,PVar5,CREATE_PARENT|MODIFY|CREATE,true);
      if (bVar2) {
        PVar5.parts.size_ = finalName_local.parts.size_;
        PVar5.parts.ptr = finalName_local.parts.ptr;
        local_58.disposer = (tryCreate->impl).disposer;
        local_58.ptr = (tryCreate->impl).ptr;
        this_00 = &local_58;
        (tryCreate->impl).ptr = (Iface *)0x0;
        createNamedTemporary
                  (__return_storage_ptr__,this,PVar5,mode & ~CREATE_PARENT,
                   (Function<int_(kj::StringPtr)> *)this_00);
        goto LAB_0031c28f;
      }
    }
  }
  else if (iVar3 == 0x11) {
    finalName_00.parts.size_ = finalName_local.parts.size_;
    finalName_00.parts.ptr = finalName_local.parts.ptr;
    local_48.disposer = (tryCreate->impl).disposer;
    local_48.ptr = (tryCreate->impl).ptr;
    this_00 = &local_48;
    (tryCreate->impl).ptr = (Iface *)0x0;
    createNamedTemporary
              (__return_storage_ptr__,this,finalName_00,mode,
               (Function<int_(kj::StringPtr)> *)this_00);
LAB_0031c28f:
    Own<kj::Function<int_(kj::StringPtr)>::Iface>::dispose(this_00);
    goto LAB_0031c3aa;
  }
  _::Debug::Fault::Fault<int,kj::String&>
            (&f_1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
             ,0x38a,iVar3,"create(path)","path",&path);
  _::Debug::Fault::~Fault(&f_1);
  (__return_storage_ptr__->ptr).isSet = false;
LAB_0031c3aa:
  Array<char>::~Array(&path.content);
  Array<char>::~Array(&pathPrefix.content);
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<String> createNamedTemporary(
      PathPtr finalName, WriteMode mode, Function<int(StringPtr)> tryCreate) const {
    // Create a temporary file which will eventually replace `finalName`.
    //
    // Calls `tryCreate` to actually create the temporary, passing in the desired path. tryCreate()
    // is expected to behave like a syscall, returning a negative value and setting `errno` on
    // error. tryCreate() MUST fail with EEXIST if the path exists -- this is not checked in
    // advance, since it needs to be checked atomically. In the case of EEXIST, tryCreate() will
    // be called again with a new path.
    //
    // Returns the temporary path that succeeded. Only returns nullptr if there was an exception
    // but we're compiled with -fno-exceptions.

    if (finalName.size() == 0) {
      KJ_FAIL_REQUIRE("can't replace self") { break; }
      return nullptr;
    }

    static uint counter = 0;
    static const pid_t pid = getpid();
    String pathPrefix;
    if (finalName.size() > 1) {
      pathPrefix = kj::str(finalName.parent(), '/');
    }
    auto path = kj::str(pathPrefix, HIDDEN_PREFIX, pid, '.', counter++, '.',
                        finalName.basename()[0], ".partial");

    KJ_SYSCALL_HANDLE_ERRORS(tryCreate(path)) {
      case EEXIST:
        return createNamedTemporary(finalName, mode, kj::mv(tryCreate));
      case ENOENT:
        if (has(mode, WriteMode::CREATE_PARENT) && finalName.size() > 1 &&
            tryMkdir(finalName.parent(), WriteMode::CREATE | WriteMode::MODIFY |
                                         WriteMode::CREATE_PARENT, true)) {
          // Retry, but make sure we don't try to create the parent again.
          mode = mode - WriteMode::CREATE_PARENT;
          return createNamedTemporary(finalName, mode, kj::mv(tryCreate));
        }
        // fallthrough
      default:
        KJ_FAIL_SYSCALL("create(path)", error, path) { break; }
        return nullptr;
    }

    return kj::mv(path);
  }